

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void xmlListSort(xmlListPtr l)

{
  xmlListPtr old;
  
  if ((l != (xmlListPtr)0x0) && (l->sentinel->next != l->sentinel)) {
    old = xmlListDup(l);
    if (old != (xmlListPtr)0x0) {
      xmlListClear(l);
      xmlListCopy(l,old);
      xmlListClear(old);
      xmlListClear(old);
      (*xmlFree)(old->sentinel);
      (*xmlFree)(old);
      return;
    }
  }
  return;
}

Assistant:

void
xmlListSort(xmlListPtr l)
{
    xmlListPtr lTemp;

    if (l == NULL)
        return;
    if(xmlListEmpty(l))
        return;

    /* I think that the real answer is to implement quicksort, the
     * alternative is to implement some list copying procedure which
     * would be based on a list copy followed by a clear followed by
     * an insert. This is slow...
     */

    lTemp = xmlListDup(l);
    if (lTemp == NULL)
        return;
    xmlListClear(l);
    xmlListMerge(l, lTemp);
    xmlListDelete(lTemp);
}